

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExternalFunction.cpp
# Opt level: O2

bool Js::JavascriptExternalFunction::DeferredLengthInitializer
               (DynamicObject *instance,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary::InitializeFunction<true,true,true,true>(instance,typeHandler,mode);
  UndeferLength((JavascriptExternalFunction *)instance,
                (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                super_JavascriptLibraryBase).scriptContext.ptr);
  return true;
}

Assistant:

bool __cdecl JavascriptExternalFunction::DeferredLengthInitializer(DynamicObject * instance, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        Js::JavascriptLibrary::InitializeFunction<true, true, true, true>(instance, typeHandler, mode);

        JavascriptExternalFunction* object = static_cast<JavascriptExternalFunction*>(instance);

        object->UndeferLength(instance->GetScriptContext());

        return true;
    }